

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext_conflict1 *ctx,ImGuiID id)

{
  int *piVar1;
  void *pvVar2;
  ImGuiDockNode *val;
  ImGuiDockContext *this;
  
  this = &ctx->DockContext;
  if (id == 0) {
    id = 0;
    do {
      id = id + 1;
      pvVar2 = ImGuiStorage::GetVoidPtr(&this->Nodes,id);
    } while (pvVar2 != (void *)0x0);
  }
  else {
    pvVar2 = ImGuiStorage::GetVoidPtr(&this->Nodes,id);
    if (pvVar2 != (void *)0x0) {
      __assert_fail("DockContextFindNodeByID(ctx, id) == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x32b4,"ImGuiDockNode *ImGui::DockContextAddNode(ImGuiContext *, ImGuiID)");
    }
  }
  if (GImGui != (ImGuiContext_conflict1 *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  val = (ImGuiDockNode *)(*GImAllocatorAllocFunc)(0xc0,GImAllocatorUserData);
  (val->Windows).Size = 0;
  (val->Windows).Capacity = 0;
  (val->Windows).Data = (ImGuiWindow_conflict **)0x0;
  (val->WindowClass).ViewportFlagsOverrideClear = 0;
  (val->WindowClass).TabItemFlagsOverrideSet = 0;
  (val->WindowClass).DockNodeFlagsOverrideSet = 0;
  (val->WindowClass).DockingAlwaysTabBar = false;
  (val->WindowClass).DockingAllowUnclassed = false;
  *(undefined2 *)&(val->WindowClass).field_0x1a = 0;
  (val->WindowClass).ClassId = 0;
  (val->WindowClass).ParentViewportId = 0;
  (val->WindowClass).ViewportFlagsOverrideSet = 0;
  (val->WindowClass).ViewportFlagsOverrideClear = 0;
  (val->Pos).x = 0.0;
  (val->Pos).y = 0.0;
  (val->Size).x = 0.0;
  (val->Size).y = 0.0;
  (val->SizeRef).x = 0.0;
  (val->SizeRef).y = 0.0;
  (val->WindowClass).DockingAllowUnclassed = true;
  val->ID = id;
  val->TabBar = (ImGuiTabBar *)0x0;
  val->SharedFlags = 0;
  val->LocalFlags = 0;
  val->LocalFlagsInWindows = 0;
  val->MergedFlags = 0;
  val->ParentNode = (ImGuiDockNode *)0x0;
  val->ChildNodes[0] = (ImGuiDockNode *)0x0;
  val->ChildNodes[1] = (ImGuiDockNode *)0x0;
  val->SplitAxis = ImGuiAxis_None;
  val->State = ImGuiDockNodeState_Unknown;
  val->HostWindow = (ImGuiWindow_conflict *)0x0;
  val->VisibleWindow = (ImGuiWindow_conflict *)0x0;
  val->CentralNode = (ImGuiDockNode *)0x0;
  val->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  val->CountNodeWithWindows = 0;
  val->LastFrameAlive = -1;
  val->LastFrameActive = -1;
  val->LastFrameFocused = -1;
  val->LastFocusedNodeId = 0;
  val->SelectedTabId = 0;
  val->WantCloseTabId = 0;
  *(undefined2 *)&val->field_0xbc = 0x209;
  val->field_0xbe = val->field_0xbe & 0xf0;
  ImGuiStorage::SetVoidPtr(&this->Nodes,id,val);
  return val;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext.Nodes.SetVoidPtr(node->ID, node);
    return node;
}